

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::LookAt
          (FormattingScene *this,Float ex,Float ey,Float ez,Float lx,Float ly,Float lz,Float ux,
          Float uy,Float uz,FileLoc loc)

{
  Float uy_local;
  Float ux_local;
  Float lz_local;
  Float ly_local;
  Float lx_local;
  Float ez_local;
  Float ey_local;
  Float ex_local;
  string local_80;
  string local_60;
  string local_40;
  
  uy_local = uy;
  ux_local = ux;
  lz_local = lz;
  ly_local = ly;
  lx_local = lx;
  ez_local = ez;
  ey_local = ey;
  ex_local = ex;
  indent_abi_cxx11_(&local_60,this,0);
  indent_abi_cxx11_(&local_80,this,0);
  indent_abi_cxx11_(&local_40,this,0);
  Printf<std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&>
            ("%sLookAt %f %f %f\n%s    %f %f %f\n%s    %f %f %f\n",&local_60,&ex_local,&ey_local,
             &ez_local,&local_80,&lx_local,&ly_local,&lz_local,&local_40,&ux_local,&uy_local,&uz);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void FormattingScene::LookAt(Float ex, Float ey, Float ez, Float lx, Float ly, Float lz,
                             Float ux, Float uy, Float uz, FileLoc loc) {
    Printf("%sLookAt %f %f %f\n%s    %f %f %f\n%s    %f %f %f\n", indent(), ex, ey, ez,
           indent(), lx, ly, lz, indent(), ux, uy, uz);
}